

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_window.cc
# Opt level: O0

void anon_unknown.dwarf_20a76::MakeBlackman
               (bool periodic,vector<double,_std::allocator<double>_> *window)

{
  initializer_list<double> __l;
  byte bVar1;
  undefined4 uVar2;
  size_type sVar3;
  vector<double,_std::allocator<double>_> *in_RSI;
  byte in_DIL;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  CosineWindow maker;
  undefined4 in_stack_ffffffffffffff60;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff70;
  allocator_type *__a;
  vector<double,_std::allocator<double>_> *this;
  iterator pdVar4;
  undefined1 *puVar5;
  undefined1 in_stack_ffffffffffffffbf;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  CosineWindow *in_stack_ffffffffffffffd0;
  undefined7 in_stack_fffffffffffffff8;
  
  bVar1 = in_DIL & 1;
  sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
  uVar2 = (undefined4)sVar3;
  pdVar4 = (iterator)0x3fb47ae147ae147b;
  __a = (allocator_type *)0x3fdae147ae147ae1;
  this = (vector<double,_std::allocator<double>_> *)0x3fe0000000000000;
  puVar5 = &stack0xffffffffffffff88;
  std::allocator<double>::allocator((allocator<double> *)0x119bf9);
  __l._M_len = (size_type)puVar5;
  __l._M_array = pdVar4;
  std::vector<double,_std::allocator<double>_>::vector(this,__l,__a);
  sptk::CosineWindow::CosineWindow
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,
             (bool)in_stack_ffffffffffffffbf);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff70);
  std::allocator<double>::~allocator((allocator<double> *)0x119c48);
  sptk::CosineWindow::Get((CosineWindow *)&stack0xffffffffffffffc8);
  std::vector<double,_std::allocator<double>_>::operator=
            (unaff_retaddr,
             (vector<double,_std::allocator<double>_> *)CONCAT17(bVar1,in_stack_fffffffffffffff8));
  sptk::CosineWindow::~CosineWindow((CosineWindow *)CONCAT44(uVar2,in_stack_ffffffffffffff60));
  return;
}

Assistant:

void MakeBlackman(bool periodic, std::vector<double>* window) {
  sptk::CosineWindow maker(static_cast<int>(window->size()), {0.42, 0.5, 0.08},
                           periodic);
  *window = maker.Get();
}